

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O3

char * rtosc_skip_next_printed_arg
                 (char *src,int *skipped,char *type,char *llhssrc,int follow_ellipsis,
                 int inside_bundle)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int32_t iVar4;
  ushort **ppuVar5;
  char *pcVar6;
  size_t sVar7;
  void *pvVar8;
  char *pcVar9;
  size_t sVar10;
  ulong uVar11;
  rtosc_arg_val_t *rhsarg;
  byte bVar12;
  _func_int_int *property;
  _func_int_int *p_Var13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  bool bVar17;
  char deltaless_range_type;
  char rhstype [2];
  int rd;
  char llhstype;
  char dummy;
  size_t zero;
  char arraytype_cur;
  int blobsize;
  int rhsskipped;
  int llhsskipped;
  rtosc_arg_val_t delta;
  char *local_e8;
  int local_e0;
  byte local_d9;
  char *local_d8;
  byte local_ca [2];
  char *local_c8;
  _func_int_int *local_c0;
  char *local_b8 [3];
  byte local_9a;
  undefined1 local_99;
  char *local_98;
  int *local_90;
  size_t local_88;
  rtosc_arg_val_t local_80;
  rtosc_arg_val_t local_68;
  int local_50;
  int local_4c;
  rtosc_arg_val_t local_48;
  
  p_Var13 = (_func_int_int *)&local_99;
  if (type != (char *)0x0) {
    p_Var13 = (_func_int_int *)type;
  }
  *skipped = 1;
  local_d9 = 0;
  bVar12 = *src;
  local_e8 = src;
  local_c8 = src;
  local_90 = skipped;
  if (bVar12 < 0x5b) {
    if (bVar12 < 0x27) {
      if (bVar12 != 0x22) {
        if (bVar12 == 0x23) {
          ppuVar5 = __ctype_b_loc();
          uVar11 = 0;
          pcVar9 = src;
          do {
            pcVar6 = pcVar9;
            if (((*ppuVar5)[pcVar6[1]] & 0x1000) == 0) break;
            bVar17 = uVar11 < 7;
            uVar11 = uVar11 + 1;
            pcVar9 = pcVar6 + 1;
          } while (bVar17);
          local_e8 = (char *)0x0;
          if (((*ppuVar5)[pcVar6[1]] & 0x1000) != 0) {
            local_e8 = pcVar6 + 2;
          }
          *p_Var13 = (_func_int_int)0x72;
        }
        else {
LAB_0010ee04:
          iVar3 = is_range_multiplier(src);
          if (iVar3 == 0) {
            local_d8 = (char *)CONCAT44(local_d8._4_4_,follow_ellipsis);
            pcVar9 = src;
            if ((bVar12 == 0x5f) ||
               (ppuVar5 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar5 + (long)(char)bVar12 * 2 + 1) & 4) != 0)) {
              while ((bVar12 == 0x5f ||
                     (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(char)bVar12] & 8) != 0))) {
                bVar12 = pcVar9[1];
                pcVar9 = pcVar9 + 1;
              }
              *p_Var13 = (_func_int_int)0x53;
              local_e8 = pcVar9;
            }
            else {
              local_b8[0] = (char *)((ulong)local_b8[0] & 0xffffffff00000000);
              __isoc99_sscanf(src,"%*4d-%*1d%*1d-%*1d%*1d%n",local_b8);
              pcVar9 = src + (int)local_b8[0];
              local_e8 = pcVar9;
              if ((long)(int)local_b8[0] == 0) {
                property = p_Var13;
                sVar10 = skip_numeric(&local_e8,(char *)p_Var13);
                if (sVar10 == 0) {
                  local_e8 = (char *)0x0;
                }
                else {
                  local_b8[0] = local_e8;
                  skip_while(local_b8,property);
                  if (*local_b8[0] == '(') {
                    if (((byte)*p_Var13 | 2) == 0x66) {
                      local_e8 = local_b8[0] + 1;
                      skip_while(&local_e8,property);
                      sVar10 = skip_numeric(&local_e8,(char *)0x0);
                      pcVar9 = local_e8;
                      if (sVar10 != 0) {
                        local_80._0_4_ = 0;
                        __isoc99_sscanf(local_e8," )%n",&local_80);
                        local_e8 = pcVar9 + (int)local_80._0_4_;
                        if ((long)(int)local_80._0_4_ != 0) goto LAB_0010f100;
                      }
                    }
                    local_e8 = (char *)0x0;
                  }
                }
              }
              else {
                local_b8[0] = (char *)((ulong)local_b8[0] & 0xffffffff00000000);
                __isoc99_sscanf(pcVar9," %*2d:%*1d%*1d%n",local_b8);
                pcVar9 = pcVar9 + (int)local_b8[0];
                local_e8 = pcVar9;
                if ((long)(int)local_b8[0] != 0) {
                  local_b8[0] = (char *)((ulong)local_b8[0] & 0xffffffff00000000);
                  __isoc99_sscanf(pcVar9,":%*1d%*1d%n",local_b8);
                  pcVar9 = pcVar9 + (int)local_b8[0];
                  local_e8 = pcVar9;
                  if ((long)(int)local_b8[0] != 0) {
                    local_b8[0] = (char *)((ulong)local_b8[0] & 0xffffffff00000000);
                    __isoc99_sscanf(pcVar9,".%*d%n",local_b8);
                    pcVar9 = pcVar9 + (int)local_b8[0];
                    local_e8 = pcVar9;
                    if ((long)(int)local_b8[0] != 0) {
                      local_b8[0] = (char *)((ulong)local_b8[0] & 0xffffffff00000000);
                      __isoc99_sscanf(pcVar9," ( ... + 0x%n",local_b8);
                      pcVar9 = pcVar9 + (int)local_b8[0];
                      local_e8 = pcVar9;
                      if ((long)(int)local_b8[0] != 0) {
                        local_b8[0] = (char *)((ulong)local_b8[0] & 0xffffffff00000000);
                        __isoc99_sscanf(pcVar9,"%*x.%n",local_b8);
                        lVar16 = (long)(int)local_b8[0];
                        local_b8[0] = (char *)((ulong)local_b8[0] & 0xffffffff00000000);
                        __isoc99_sscanf(pcVar9 + lVar16,"%*xp%n",local_b8);
                        pcVar9 = pcVar9 + lVar16 + (int)local_b8[0];
                        if ((long)(int)local_b8[0] == 0) {
                          local_e8 = (char *)0x0;
                          src = local_c8;
                        }
                        else {
                          local_b8[0] = (char *)((ulong)local_b8[0] & 0xffffffff00000000);
                          local_e8 = pcVar9;
                          local_98 = llhssrc;
                          __isoc99_sscanf(pcVar9,"-%d s )%n",&local_80,local_b8);
                          local_e8 = (char *)0x0;
                          if (local_80._0_4_ - 1 < 0x20) {
                            local_e8 = pcVar9 + (int)local_b8[0];
                          }
                          src = local_c8;
                          llhssrc = local_98;
                          if ((long)(int)local_b8[0] == 0) {
                            local_e8 = (char *)0x0;
                          }
                        }
                      }
                    }
                  }
                }
                *p_Var13 = (_func_int_int)0x74;
              }
            }
            goto LAB_0010f100;
          }
          local_e8 = src + 1;
          do {
            cVar2 = *local_e8;
            local_e8 = local_e8 + 1;
          } while (cVar2 != 'x');
          local_e8 = rtosc_skip_next_printed_arg
                               (local_e8,(int *)local_b8,(char *)&local_d9,(char *)0x0,0,
                                inside_bundle);
          if (local_e8 != (char *)0x0) {
            *p_Var13 = (_func_int_int)0x2d;
            *local_90 = *local_90 + (int)local_b8[0];
          }
        }
        goto LAB_0010f104;
      }
      local_d8 = (char *)CONCAT44(local_d8._4_4_,follow_ellipsis);
      cVar2 = src[1];
      local_e0 = inside_bundle;
      local_c0 = p_Var13;
      local_98 = llhssrc;
      if (cVar2 != '\0') {
        pcVar9 = src + 1;
        bVar17 = false;
        do {
          if ((bool)((bVar17 ^ 1U) & cVar2 == '\"')) {
            if (pcVar9[1] != '\\') {
              local_e8 = pcVar9 + 1;
              if (pcVar9[1] != 'S') goto LAB_0010eb38;
              *local_c0 = (_func_int_int)0x53;
              p_Var13 = local_c0;
              src = local_c8;
              llhssrc = local_98;
              inside_bundle = local_e0;
              local_e8 = pcVar9 + 2;
              goto LAB_0010f100;
            }
            local_b8[0] = (char *)((ulong)local_b8[0] & 0xffffffff00000000);
            bVar17 = false;
            __isoc99_sscanf(pcVar9,"\"\\ \"%n",local_b8);
            cVar2 = pcVar9[(int)local_b8[0]];
            pcVar9 = pcVar9 + (int)local_b8[0];
          }
          else {
            if ((bVar17) && (cVar1 = get_escaped_char(cVar2,0), cVar1 == '\0')) break;
            bVar17 = (bool)(cVar2 == '\\' & (bVar17 ^ 1U));
            cVar2 = pcVar9[1];
            pcVar9 = pcVar9 + 1;
          }
        } while (cVar2 != '\0');
      }
      local_e8 = (char *)0x0;
LAB_0010eb38:
      *local_c0 = (_func_int_int)0x73;
      p_Var13 = local_c0;
      src = local_c8;
      llhssrc = local_98;
      inside_bundle = local_e0;
    }
    else {
      if (bVar12 != 0x27) {
        if (bVar12 == 0x42) {
          local_b8[0] = (char *)((ulong)local_b8[0] & 0xffffffff00000000);
          pcVar9 = (char *)0x0;
          local_e0 = inside_bundle;
          __isoc99_sscanf(src,"BLOB [ %n",local_b8);
          lVar16 = (long)(int)local_b8[0];
          if (lVar16 == 0) {
            *p_Var13 = (_func_int_int)0x53;
            local_e8 = skip_identifier(src);
            inside_bundle = local_e0;
          }
          else {
            *p_Var13 = (_func_int_int)0x62;
            local_80._0_4_ = 0;
            local_68._0_4_ = 0;
            local_c0 = p_Var13;
            __isoc99_sscanf(src + lVar16,"%i %n",&local_68,&local_80);
            inside_bundle = local_e0;
            if ((long)(int)local_80._0_4_ != 0) {
              local_d8 = (char *)CONCAT44(local_d8._4_4_,follow_ellipsis);
              pcVar9 = src + lVar16 + (int)local_80._0_4_;
              do {
                if (*pcVar9 != '0') {
                  follow_ellipsis = (int)local_d8;
                  goto LAB_0010f2f0;
                }
                local_b8[0] = (char *)((ulong)local_b8[0] & 0xffffffff00000000);
                __isoc99_sscanf(pcVar9,"0x%*x %n",local_b8);
                pcVar9 = pcVar9 + (int)local_b8[0];
                local_68._0_4_ = local_68._0_4_ + -1;
              } while ((long)(int)local_b8[0] != 0);
              pcVar9 = (char *)0x0;
              follow_ellipsis = (int)local_d8;
            }
LAB_0010f2f0:
            p_Var13 = local_c0;
            if (local_68._0_4_ == 0) {
              local_e8 = pcVar9;
              if (pcVar9 != (char *)0x0) {
                local_e8 = (char *)0x0;
                if (*pcVar9 == ']') {
                  local_e8 = pcVar9 + 1;
                }
              }
            }
            else {
              local_e8 = (char *)0x0;
            }
          }
          goto LAB_0010f104;
        }
        if (bVar12 != 0x4d) goto LAB_0010ee04;
        iVar3 = strncmp("MIDI",src,4);
        pcVar9 = src;
        if (iVar3 == 0) {
          ppuVar5 = __ctype_b_loc();
          if (((long)src[4] == 0x5b) || (((*ppuVar5)[src[4]] & 0x2000) != 0)) {
            local_b8[0] = (char *)((ulong)local_b8[0] & 0xffffffff00000000);
            __isoc99_sscanf(src,"MIDI [ 0x%*x 0x%*x 0x%*x 0x%*x ]%n",local_b8);
            local_e8 = src + (int)local_b8[0];
            if ((long)(int)local_b8[0] == 0) {
              local_e8 = (char *)0x0;
            }
            *p_Var13 = (_func_int_int)0x6d;
            goto LAB_0010f104;
          }
        }
LAB_0010eeb1:
        local_e8 = skip_identifier(pcVar9);
        *p_Var13 = (_func_int_int)0x53;
        goto LAB_0010f104;
      }
      sVar7 = strlen(src);
      if (sVar7 < 3) {
        return (char *)0x0;
      }
      local_d8 = (char *)CONCAT44(local_d8._4_4_,follow_ellipsis);
      pcVar9 = src;
      if ((src[1] == '\\') &&
         ((cVar2 = src[2], cVar2 != '\'' ||
          ((cVar1 = src[3], (long)cVar1 != 0 &&
           (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0
           )))))) {
        cVar2 = get_escaped_char(cVar2,1);
        if (cVar2 != '\0') {
          pcVar9 = src + 1;
          goto LAB_0010ecbb;
        }
        local_e8 = (char *)0x0;
      }
      else {
LAB_0010ecbb:
        local_e8 = (char *)0x0;
        if (pcVar9[2] == '\'') {
          local_e8 = pcVar9 + 3;
        }
      }
      *p_Var13 = (_func_int_int)0x63;
    }
LAB_0010f100:
    follow_ellipsis = (int)local_d8;
  }
  else if (bVar12 < 0x69) {
    if (bVar12 == 0x5b) {
      local_d8 = (char *)CONCAT44(local_d8._4_4_,follow_ellipsis);
      local_e0 = inside_bundle;
      local_c0 = p_Var13;
      local_98 = llhssrc;
      ppuVar5 = __ctype_b_loc();
      local_e8 = src;
      do {
        pcVar9 = local_e8 + 1;
        local_e8 = local_e8 + 1;
      } while ((*(byte *)((long)*ppuVar5 + (long)*pcVar9 * 2 + 1) & 0x20) != 0);
      pcVar9 = local_e8;
      pcVar6 = (char *)0x0;
      cVar2 = '\0';
      do {
        pcVar15 = pcVar9;
        if (*pcVar15 == '\0') break;
        if (*pcVar15 == ']') {
          local_e8 = pcVar15 + 1;
          goto LAB_0010f0b5;
        }
        local_80.type = 0x14;
        pcVar9 = rtosc_skip_next_printed_arg(pcVar15,(int *)local_b8,&local_80.type,pcVar6,1,1);
        if (pcVar9 == (char *)0x0) {
          pcVar9 = (char *)0x0;
        }
        else {
          pcVar9 = pcVar9 + -1;
          do {
            pcVar6 = pcVar9 + 1;
            pcVar9 = pcVar9 + 1;
          } while ((*(byte *)((long)*ppuVar5 + (long)*pcVar6 * 2 + 1) & 0x20) != 0);
        }
        cVar1 = local_80.type;
        if ((((cVar2 != '\0') && (cVar1 = cVar2, cVar2 != local_80.type)) && (cVar2 != '-')) &&
           (((local_80.type != '-' && (cVar1 = 'T', local_80.type != 'F' || cVar2 != 'T')) &&
            ((cVar2 != 'F' || (cVar1 = 'F', local_80.type != 'T')))))) {
          *skipped = *skipped + (int)local_b8[0];
          break;
        }
        *skipped = *skipped + (int)local_b8[0];
        pcVar6 = pcVar15;
        cVar2 = cVar1;
      } while (pcVar9 != (char *)0x0);
      local_e8 = (char *)0x0;
LAB_0010f0b5:
      *local_c0 = (_func_int_int)0x61;
      p_Var13 = local_c0;
      src = local_c8;
      llhssrc = local_98;
      inside_bundle = local_e0;
      goto LAB_0010f100;
    }
    if (bVar12 != 0x66) goto LAB_0010ee04;
    pcVar6 = skip_word("false",&local_e8);
    pcVar9 = local_e8;
    if (pcVar6 == (char *)0x0) goto LAB_0010eeb1;
    *p_Var13 = (_func_int_int)0x46;
  }
  else if (bVar12 == 0x69) {
    pcVar9 = skip_word("inf",&local_e8);
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "immediately";
LAB_0010ee93:
      pcVar6 = skip_word(pcVar9,&local_e8);
      pcVar9 = local_e8;
      if (pcVar6 == (char *)0x0) goto LAB_0010eeb1;
      *p_Var13 = (_func_int_int)0x74;
    }
    else {
      *p_Var13 = (_func_int_int)0x49;
    }
  }
  else if (bVar12 == 0x6e) {
    pcVar9 = skip_word("nil",&local_e8);
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "now";
      goto LAB_0010ee93;
    }
    *p_Var13 = (_func_int_int)0x4e;
  }
  else {
    if (bVar12 != 0x74) goto LAB_0010ee04;
    pcVar6 = skip_word("true",&local_e8);
    pcVar9 = local_e8;
    if (pcVar6 == (char *)0x0) goto LAB_0010eeb1;
    *p_Var13 = (_func_int_int)0x54;
  }
LAB_0010f104:
  pcVar9 = local_e8;
  if (local_e8 == (char *)0x0 || follow_ellipsis == 0) {
    return local_e8;
  }
  local_c8 = src;
  ppuVar5 = __ctype_b_loc();
  pcVar6 = local_c8;
  pcVar15 = pcVar9 + 1;
  do {
    pcVar14 = pcVar15;
    pcVar15 = pcVar14 + 1;
  } while ((*(byte *)((long)*ppuVar5 + (long)pcVar14[-1] * 2 + 1) & 0x20) != 0);
  if (pcVar14[-1] != '.') {
    return pcVar9;
  }
  if (*pcVar14 != '.') {
    return pcVar9;
  }
  if (*pcVar15 != '.') {
    return pcVar9;
  }
  local_e8 = (char *)0x0;
  iVar3 = is_range_multiplier(local_c8);
  if (iVar3 != 0) {
    local_c8 = strchr(pcVar6,0x78);
    local_c8 = local_c8 + 1;
  }
  bVar12 = local_d9;
  if (local_d9 == 0) {
    bVar12 = (byte)*p_Var13;
  }
  local_d8 = pcVar14 + -1;
  local_ca[0] = 0x78;
  local_ca[1] = 0;
  *p_Var13 = (_func_int_int)0x2d;
  local_88 = 0;
  do {
    cVar2 = pcVar15[1];
    pcVar15 = pcVar15 + 1;
  } while ((*(byte *)((long)*ppuVar5 + (long)cVar2 * 2 + 1) & 0x20) != 0);
  local_e0 = inside_bundle;
  pvVar8 = memchr("cihfdTF",(int)(char)bVar12,8);
  if (cVar2 == ']') {
    local_ca[0] = bVar12;
    pcVar9 = pcVar15;
    if (pvVar8 != (void *)0x0) goto LAB_0010f264;
  }
  else {
    if (pvVar8 == (void *)0x0) {
      return local_e8;
    }
    pcVar9 = rtosc_skip_next_printed_arg(pcVar15,&local_50,(char *)local_ca,(char *)0x0,0,local_e0);
    if (pcVar9 == (char *)0x0) {
      return local_e8;
    }
    rtosc_scan_arg_val(pcVar15,&local_68,1,(char *)0x0,&local_88,0,0);
    if (bVar12 != local_ca[0]) {
      return local_e8;
    }
LAB_0010f264:
    rtosc_scan_arg_val(local_c8,&local_80,1,(char *)0x0,&local_88,0,0);
    pcVar15 = pcVar9;
  }
  bVar17 = true;
  local_c8 = (char *)pvVar8;
  if (llhssrc != (char *)0x0) {
    pcVar9 = strstr(llhssrc,"...");
    if (pcVar9 < local_d8) {
      llhssrc = pcVar9 + 2;
      do {
        pcVar9 = llhssrc + 1;
        llhssrc = llhssrc + 1;
      } while ((*(byte *)((long)*ppuVar5 + (long)*pcVar9 * 2 + 1) & 0x20) != 0);
    }
    else {
      iVar3 = is_range_multiplier(llhssrc);
      if (iVar3 != 0) {
        pcVar9 = strchr(llhssrc,0x78);
        llhssrc = pcVar9 + 1;
      }
    }
    rtosc_skip_next_printed_arg(llhssrc,&local_4c,(char *)&local_9a,(char *)0x0,0,local_e0);
    if (((local_9a == bVar12) || (bVar12 == 0x46 && local_9a == 0x54)) ||
       (bVar12 == 0x54 && local_9a == 0x46)) {
      rtosc_scan_arg_val(llhssrc,(rtosc_arg_val_t *)local_b8,1,(char *)0x0,&local_88,0,0);
      iVar3 = rtosc_arg_vals_cmp_single
                        ((rtosc_arg_val_t *)local_b8,&local_80,(rtosc_cmp_options *)0x0);
      bVar17 = iVar3 == 0;
    }
  }
  if (cVar2 == ']') {
    if (local_c8 == (char *)0x0 || bVar17 != false) {
      iVar3 = *local_90;
      goto LAB_0010f49a;
    }
    rhsarg = (rtosc_arg_val_t *)0x0;
  }
  else {
    rhsarg = &local_68;
  }
  iVar4 = delta_from_arg_vals((rtosc_arg_val_t *)local_b8,&local_80,rhsarg,&local_48,(uint)bVar17);
  if ((cVar2 != ']') && (iVar4 == -1)) {
    return local_e8;
  }
  iVar3 = (uint)(iVar4 != -1) + *local_90;
LAB_0010f49a:
  *local_90 = iVar3 + 1;
  return pcVar15;
}

Assistant:

const char* rtosc_skip_next_printed_arg(const char* src, int* skipped,
                                        char* type, const char* llhssrc,
                                        int follow_ellipsis, int inside_bundle)
{
    char dummy;
    if(!type)
        type = &dummy;
    assert(skipped);
    assert(src);
    *skipped = 1; // in almost all cases

    char deltaless_range_type = 0;

    const char* old_src = src;
    switch(*src)
    {
        case 't':
            if(skip_word("true", &src))
                *type = 'T';
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case 'f':
            if(skip_word("false", &src))
                *type = 'F';
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case 'n':
            if(skip_word("nil", &src))
                *type = 'N';
            else if(skip_word("now", &src))
                *type = 't';
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case 'i':
            if(skip_word("inf", &src))
                *type = 'I';
            else if(skip_word("immediately", &src))
                *type = 't';
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case '#':
            for(size_t i = 0; i<8; ++i)
            {
                ++src;
                if(!isxdigit(*src)) {
                    src = NULL;
                    i = 8;
                }
            }
            if(src) ++src;
            *type = 'r';
            break;
        case '\'':
        {
            int esc = -1;
            if(strlen(src) < 3)
                return NULL;
            // type 1: '<noslash>' => normal char
            // type 2: '\<noquote>' => escaped char
            // type 3: '\'' => escaped quote
            // type 4: '\' => mistyped backslash
            if(src[1] == '\\') {
                if(src[2] == '\'' && (!src[3] || isspace(src[3])))
                {
                    // type 4
                    // the user inputs '\', which is wrong, but
                    // we accept it as a backslash anyways
                }
                else
                {
                    ++src; // type 2 or 3
                    esc = get_escaped_char(src[1], 1);
                }
            }
            // if the last char was no single quote,
            // or we had an invalid escape sequence, return NULL
            src = (!esc || src[2] != '\'') ? NULL : (src + 3);
            *type = 'c';
            break;
        }
        case '"':
            src = end_of_printed_string(src);
            if(src && *src == 'S') {
                ++src;
                *type = 'S';
            }
            else
                *type = 's';
            break;
        case 'M':
            if(!strncmp("MIDI", src, 4) && (isspace(src[4]) || src[4] == '['))
            {
                skip_fmt_null(&src, "MIDI [ 0x%*x 0x%*x 0x%*x 0x%*x ]%n");
                *type = 'm';
            }
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case '[':
        {
            while(isspace(*++src));
            char arraytype = 0;
            const char* recent_src = NULL;
            while(src && *src && *src != ']')
            {
                char arraytype_cur = 20;
                int skipped2;
                const char* newsrc = rtosc_skip_next_printed_arg(src, &skipped2,
                                                                 &arraytype_cur,
                                                                 recent_src, 1,
                                                                 true);
                recent_src = src;
                src = newsrc;

                if(src)
                    for( ; isspace(*src); ++src) ;
                if(!arraytype)
                    arraytype = arraytype_cur;
                else if(!arraytypes_match(arraytype, arraytype_cur))
                    src = NULL;
                *skipped += skipped2;
            }
            if(src)
            {
                if(*src) // => ']'
                    ++src;
                else
                    src = NULL;
            }
            *type = 'a';
            break;
        }
        case 'B':
        {
            const char* oldsrc = src;
            skip_fmt_null(&src, "BLOB [ %n");
            if(src)
            {
                *type = 'b';
                int rd = 0, blobsize = 0;
                sscanf(src, "%i %n", &blobsize, &rd);
                src = rd ? (src + rd) : NULL;
                for(;src && *src == '0';) // i.e. 0x...
                {
                    skip_fmt_null(&src, "0x%*x %n");
                    blobsize--;
                }
                if(blobsize)
                    src = NULL;
                if(src)
                    src = (*src == ']') ? (src + 1) : NULL;
            }
            else
            {
                *type = 'S';
                src = skip_identifier(oldsrc);
            }
            break;
        }
        default:
        {
            // nx... ? (n > 0)
            if(is_range_multiplier(src))
            {
                while(*++src != 'x') ;
                ++src;

                int skipped2;
                src = rtosc_skip_next_printed_arg(src, &skipped2,
                                                  &deltaless_range_type,
                                                  NULL, 0, inside_bundle);
                if(src) {
                    *type = '-';
                    *skipped += skipped2;
                }
            }
            // is it an identifier?
            else if(*src == '_' || isalpha(*src))
            {
                for(; *src == '_' || isalnum(*src); ++src) ;
                *type = 'S';
            }
            // is it a date? (vs a numeric)
            else if(skip_fmt(&src, "%*4d-%*1d%*1d-%*1d%*1d%n"))
            {
                if(skip_fmt(&src, " %*2d:%*1d%*1d%n"))
                if(skip_fmt(&src, ":%*1d%*1d%n"))
                if(skip_fmt(&src, ".%*d%n"))
                {
                    if(skip_fmt(&src, " ( ... + 0x%n"))
                    {
                        skip_fmt(&src, "%*x.%n");
                        if(skip_fmt(&src, "%*xp%n"))
                        {
                            int rd = 0, expm;
                            sscanf(src, "-%d s )%n", &expm, &rd);
                            if(rd && expm > 0 && expm <= 32)
                            {
                                // ok
                                src += rd;
                            }
                            else
                                src = NULL;

                        }
                        else
                            src = NULL;
                    }
                }
                *type = 't';
            }
            else
            {
                int rd = skip_numeric(&src, type);
                if(!rd) { src = NULL; break; }
                const char* after_num = src;
                skip_while(&after_num, isspace);
                if(*after_num == '(')
                {
                    if (*type == 'f' || *type == 'd')
                    {
                        // skip lossless representation
                        src = ++after_num;
                        skip_while(&src, isspace);
                        rd = skip_numeric(&src, NULL);
                        if(!rd) { src = NULL; break; }
                        skip_fmt_null(&src, " )%n");
                    }
                    else
                        src = NULL;
                }
            }
        }
    }

    if(follow_ellipsis && src)
    {
        // is the argument being followed by an ellipsis?
        const char* src2 = src;
        for(; isspace(*src2); ++src2) ;

        if(!strncmp(src2, "...", 3))
        {
            src = src2;

            // What we need to do is only checking for correctness:
            //  * lhs (left hand sign) and rhs are given
            //  * lhs and rhs must be of the same type
            //  * there must be an "n" such that lhs + n*delta = rhs
            //    => therefore, compute delta
            //  * such "n" must not be 0

            const char* rhssrc = src;
            const char* ellipsis = src;
            src = NULL;
            const char* lhssrc;

            do
            {
                lhssrc = old_src;
                if(is_range_multiplier(lhssrc))
                    lhssrc = strchr(lhssrc, 'x') + 1;

                rtosc_arg_val_t llhsarg, lhsarg, rhsarg;
                char lhstype = deltaless_range_type ? deltaless_range_type
                                                    : *type,
                     llhstype, rhstype[2] = "x";

                *type = '-'; // TODO: bug? return scanned type instead,
                             //       to avoid [0.1 1 ...5]

                size_t zero = 0;
                int llhsskipped, rhsskipped;

                rtosc_arg_val_t delta;

                /*
                 * in all cases, check rhs
                 */
                rhssrc += 2;
                while(isspace(*++rhssrc)) ;

                bool numeric_range  = strchr(numeric_range_types(), lhstype),
                     infinite_range = false;
                const char* endsrc;
                if(*rhssrc == ']')
                {
                    assert(inside_bundle);
                    // we're still not finished. find out if delta-less or not
                    *rhstype = lhstype;
                    endsrc = rhssrc;
                    infinite_range = true;
                }
                else
                {
                    // non-infinite ranges are numeric, so check the type
                    if(!numeric_range)
                        break;

                    endsrc = rtosc_skip_next_printed_arg(rhssrc, &rhsskipped,
                                                         rhstype, NULL, 0,
                                                         inside_bundle);
                    if(!endsrc)
                        break;

                    rtosc_scan_arg_val(rhssrc, &rhsarg, 1, NULL, &zero, 0, 0);
                }

                /*
                 * do not check lhs; it has been checked above
                 */
                if(lhstype != *rhstype)
                {
                    // types must be equal
                    break;
                }

                if(numeric_range)
                    rtosc_scan_arg_val(lhssrc, &lhsarg, 1,
                                       NULL, &zero, 0, 0);

                /*
                 * is llhs given and useful?
                 */
                bool llhsarg_is_useless = false;
                if(llhssrc)
                {
                    const char* next_ellipsis_from_llhssrc =
                            strstr(llhssrc, "...");
                    if(next_ellipsis_from_llhssrc < ellipsis)
                    {
                        llhssrc = next_ellipsis_from_llhssrc + 2;
                        while(isspace(*++llhssrc)) ;
                    }
                    else if(is_range_multiplier(llhssrc))
                    {
                        llhssrc = strchr(llhssrc, 'x') + 1;
                    }

                    rtosc_skip_next_printed_arg(llhssrc,
                                                &llhsskipped, &llhstype,
                                                NULL, 0, inside_bundle);
                    if(types_match(llhstype, lhstype))
                    {
                        rtosc_scan_arg_val(llhssrc, &llhsarg, 1,
                                           NULL, &zero, 0, 0);
                        if(!rtosc_arg_vals_cmp_single(&llhsarg, &lhsarg, NULL))
                        {
                            llhsarg_is_useless = true;
                        }
                        // hint: use rtosc_arg_val_range_arg here if
                        // overlapping ranges (1 ... 5 ... 9) shall be
                        // implemented
                    }
                    else
                    {
                        llhsarg_is_useless = true;
                    }
                }
                else {
                    llhsarg_is_useless = true;
                }

                bool has_delta = true;
                /*
                    compute delta and check if it matches
                */
                if(infinite_range && (llhsarg_is_useless || !numeric_range))
                {
                    has_delta = false;
                }
                else
                {
                    int32_t num = delta_from_arg_vals(&llhsarg, &lhsarg,
                                                      infinite_range ? NULL
                                                                     : &rhsarg,
                                                      &delta,
                                                      llhsarg_is_useless);

                    if(num == -1)
                    {
                        if(infinite_range)
                        {
                            has_delta = false;
                        }
                        else
                        {
                            break;
                        }
                    }
                }

                // if we made it until here, set src to non-NULL
                src = endsrc;

                // ellipsis skips 3 arg vals: range, delta, start
                if(has_delta)
                    ++*skipped;
                ++*skipped;
            } while(false);
        }
    }

    return src;
}